

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixUtils.cpp
# Opt level: O0

Polynomial * getCharacteristicPolynomial(RationalNum **matrix,uint size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  RationalNum *pRVar4;
  size_type sVar5;
  __type_conflict1 _Var6;
  RationalNum RVar7;
  RationalNum *local_a0;
  RationalNum local_80;
  uint local_6c;
  undefined1 auStack_68 [4];
  uint i_1;
  longlong local_60;
  value_type_conflict3 local_58;
  uint local_54;
  uint p;
  uint j;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rows;
  uint i;
  Polynomial *polynomial;
  uint size_local;
  RationalNum **matrix_local;
  
  if (matrix == (RationalNum **)0x0) {
    matrix_local = (RationalNum **)0x0;
  }
  else {
    matrix_local = (RationalNum **)operator_new(0x10);
    *(uint *)matrix_local = size;
    uVar2 = CONCAT44(0,*(uint *)matrix_local + 1);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
    if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pRVar4 = (RationalNum *)operator_new__(uVar3);
    if (uVar2 != 0) {
      local_a0 = pRVar4;
      do {
        RationalNum::RationalNum(local_a0);
        local_a0 = local_a0 + 1;
      } while (local_a0 != pRVar4 + uVar2);
    }
    matrix_local[1] = pRVar4;
    rows.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    while( true ) {
      uVar2 = (ulong)(uint)rows.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
      _Var6 = std::pow<int,unsigned_int>(2,size);
      if (_Var6 <= (double)uVar2) break;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p);
      local_54 = 1;
      local_58 = 0;
      while( true ) {
        uVar2 = (ulong)local_54;
        _Var6 = std::pow<int,unsigned_int>(2,size + 1);
        if (_Var6 <= (double)uVar2) break;
        if (((uint)rows.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage & local_54) != 0) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p,&local_58);
        }
        local_54 = local_54 << 1;
        local_58 = local_58 + 1;
      }
      RVar7 = getMainMinor(matrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p);
      pRVar4 = matrix_local[1];
      _auStack_68 = RVar7;
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p);
      RationalNum::operator+=(pRVar4 + (size - sVar5),(RationalNum *)auStack_68);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p);
      rows.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (uint)rows.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 1;
    }
    for (local_6c = 1; local_6c <= *(uint *)matrix_local; local_6c = local_6c + 2) {
      RationalNum::RationalNum(&local_80,-1,1);
      RationalNum::operator*=(matrix_local[1] + local_6c,&local_80);
    }
  }
  return (Polynomial *)matrix_local;
}

Assistant:

Polynomial* getCharacteristicPolynomial(RationalNum** matrix, unsigned int size) {
    if(matrix == nullptr) return nullptr;

    Polynomial* polynomial = new Polynomial;
    polynomial->degree = size;
    polynomial->coefficients = new RationalNum [polynomial->degree + 1];

    for(unsigned int i = 0; i < pow(2, size); i++) {
        vector<unsigned int>rows;
        for(unsigned int j = 1, p = 0; j < pow(2, size + 1); j *= 2, p++) {
            if((i & j) != 0) rows.push_back(p);
        }
        polynomial->coefficients[size - rows.size()] += getMainMinor(matrix, rows);
    }
    for(unsigned int i = 1; i <= polynomial->degree; i += 2) polynomial->coefficients[i] *= -1ll;

    return polynomial;
}